

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_module.cpp
# Opt level: O2

void __thiscall
dxil_spv::SPIRVModule::Impl::add_instrumented_instruction(Impl *this,Op op,Block *bb,Id id)

{
  Builder *this_00;
  pointer ppIVar1;
  _Head_base<0UL,_spv::Instruction_*,_false> this_01;
  Id IVar2;
  Id initializer;
  int iVar3;
  Id *pIVar4;
  uint uVar5;
  ulong uVar6;
  __single_object call;
  Id local_7c;
  Id local_78;
  Id local_74;
  ulong local_70;
  Id *local_68;
  Block *local_60;
  _Head_base<0UL,_spv::Instruction_*,_false> local_58;
  undefined4 local_50;
  Op local_4c;
  _Head_base<0UL,_spv::Instruction_*,_false> local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  
  if ((id != 0) && ((this->instruction_instrumentation).info.enabled == true)) {
    if (op == OpAssumeTrueKHR) {
      pIVar4 = &(this->instruction_instrumentation).assume_true_call_id;
      uVar6 = 0;
    }
    else {
      ppIVar1 = (this->builder).module.idToInstruction.
                super__Vector_base<spv::Instruction_*,_dxil_spv::ThreadLocalAllocator<spv::Instruction_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
      uVar5 = ppIVar1[id]->typeId;
      uVar6 = (ulong)uVar5;
      if (ppIVar1[uVar6]->opCode != OpTypeFloat) {
        return;
      }
      iVar3 = spv::Builder::getScalarTypeWidth(&this->builder,uVar5);
      if (iVar3 == 0x40) {
        pIVar4 = &(this->instruction_instrumentation).nan_inf_instrument_fp64_call_id;
      }
      else if (iVar3 == 0x20) {
        pIVar4 = &(this->instruction_instrumentation).nan_inf_instrument_fp32_call_id;
      }
      else if (iVar3 == 0x10) {
        pIVar4 = &(this->instruction_instrumentation).nan_inf_instrument_fp16_call_id;
      }
      else {
        pIVar4 = (Id *)0x0;
      }
    }
    local_78 = id;
    if ((this->instruction_instrumentation).should_report_instrumentation_id == 0) {
      this_00 = &this->builder;
      local_60 = bb;
      IVar2 = spv::Builder::makeBoolType(this_00);
      local_68 = pIVar4;
      initializer = spv::Builder::makeBoolConstant(this_00,true,false);
      IVar2 = create_variable_with_initializer
                        (this,StorageClassPrivate,IVar2,initializer,"ShouldReportInstrumentation");
      (this->instruction_instrumentation).should_report_instrumentation_id = IVar2;
      IVar2 = spv::Builder::makeUintType(this_00,0x20);
      local_70 = uVar6;
      local_74 = spv::Builder::makeVectorType(this_00,IVar2,4);
      IVar2 = spv::Builder::makeRuntimeArray(this_00,IVar2);
      spv::Builder::addDecoration(this_00,IVar2,DecorationArrayStride,4);
      local_48._M_head_impl = (Instruction *)0x0;
      uStack_40 = 0;
      local_38 = 0;
      local_7c = IVar2;
      std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
      _M_range_initialize<unsigned_int_const*>
                ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)&local_48,
                 &local_7c);
      IVar2 = spv::Builder::makeStructType
                        (this_00,(Vector<Id> *)&local_48,"InstrumentationControlDataSSBO");
      std::_Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>::~_Vector_base
                ((_Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_> *)
                 &local_48);
      spv::Builder::addMemberDecoration(this_00,IVar2,0,DecorationOffset,0);
      spv::Builder::addMemberName(this_00,IVar2,0,"atomics");
      spv::Builder::addDecoration(this_00,IVar2,DecorationBlock,-1);
      IVar2 = create_variable(this,StorageClassStorageBuffer,IVar2,"InstrumentationControlData");
      (this->instruction_instrumentation).global_nan_inf_control_var_id = IVar2;
      spv::Builder::addDecoration
                (this_00,IVar2,DecorationDescriptorSet,
                 (this->instruction_instrumentation).info.control_desc_set);
      spv::Builder::addDecoration
                (this_00,(this->instruction_instrumentation).global_nan_inf_control_var_id,
                 DecorationBinding,(this->instruction_instrumentation).info.control_binding);
      IVar2 = spv::Builder::makeRuntimeArray(this_00,local_74);
      spv::Builder::addDecoration(this_00,IVar2,DecorationArrayStride,0x10);
      local_48._M_head_impl = (Instruction *)0x0;
      uStack_40 = 0;
      local_38 = 0;
      local_7c = IVar2;
      std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
      _M_range_initialize<unsigned_int_const*>
                ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)&local_48,
                 &local_7c,&local_78);
      IVar2 = spv::Builder::makeStructType
                        (this_00,(Vector<Id> *)&local_48,"InstrumentationDataSSBO");
      uVar6 = local_70;
      std::_Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>::~_Vector_base
                ((_Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_> *)
                 &local_48);
      spv::Builder::addMemberName(this_00,IVar2,0,"data");
      spv::Builder::addMemberDecoration(this_00,IVar2,0,DecorationOffset,0);
      spv::Builder::addDecoration(this_00,IVar2,DecorationBlock,-1);
      pIVar4 = local_68;
      IVar2 = create_variable(this,StorageClassStorageBuffer,IVar2,"InstrumentationData");
      (this->instruction_instrumentation).global_nan_inf_data_var_id = IVar2;
      spv::Builder::addDecoration
                (this_00,IVar2,DecorationDescriptorSet,
                 (this->instruction_instrumentation).info.payload_desc_set);
      bb = local_60;
      spv::Builder::addDecoration
                (this_00,(this->instruction_instrumentation).global_nan_inf_data_var_id,
                 DecorationBinding,(this->instruction_instrumentation).info.payload_binding);
    }
    if ((pIVar4 != (Id *)0x0) && (*pIVar4 == 0)) {
      if (op == OpAssumeTrueKHR) {
        IVar2 = build_assume_true_call_function(this->self,&this->instruction_instrumentation);
      }
      else {
        IVar2 = build_nan_inf_instrument_call_function
                          (this->self,&this->instruction_instrumentation,(Id)uVar6);
      }
      *pIVar4 = IVar2;
    }
    local_7c = (this->builder).uniqueId + 1;
    (this->builder).uniqueId = local_7c;
    local_4c = spv::Builder::makeVoidType(&this->builder);
    local_50 = 0x39;
    std::make_unique<spv::Instruction,unsigned_int,unsigned_int,spv::Op>
              ((uint *)&local_48,&local_7c,&local_4c);
    spv::Instruction::addIdOperand(local_48._M_head_impl,*pIVar4);
    spv::Instruction::addIdOperand(local_48._M_head_impl,local_78);
    this_01._M_head_impl = local_48._M_head_impl;
    uVar5 = (this->instruction_instrumentation).instruction_count + 1;
    (this->instruction_instrumentation).instruction_count = uVar5;
    IVar2 = spv::Builder::makeUintConstant(&this->builder,uVar5,false);
    spv::Instruction::addIdOperand(this_01._M_head_impl,IVar2);
    local_58._M_head_impl = local_48._M_head_impl;
    local_48._M_head_impl = (Instruction *)0x0;
    spv::Block::addInstruction
              (bb,(unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> *)&local_58)
    ;
    if (local_58._M_head_impl != (Instruction *)0x0) {
      (*(local_58._M_head_impl)->_vptr_Instruction[1])();
    }
    local_58._M_head_impl = (Instruction *)0x0;
    if (local_48._M_head_impl != (Instruction *)0x0) {
      (*(local_48._M_head_impl)->_vptr_Instruction[1])();
    }
  }
  return;
}

Assistant:

void SPIRVModule::Impl::add_instrumented_instruction(spv::Op op, spv::Block *bb, spv::Id id)
{
	if (id == 0 || !instruction_instrumentation.info.enabled)
		return;

	spv::Id *call_id = nullptr;
	spv::Id type_id = 0;

	if (op == spv::OpAssumeTrueKHR)
	{
		call_id = &instruction_instrumentation.assume_true_call_id;
	}
	else
	{
		type_id = builder.getTypeId(id);
		if (builder.getTypeClass(type_id) != spv::OpTypeFloat)
			return;

		switch (builder.getScalarTypeWidth(type_id))
		{
		case 16:
			call_id = &instruction_instrumentation.nan_inf_instrument_fp16_call_id;
			break;

		case 32:
			call_id = &instruction_instrumentation.nan_inf_instrument_fp32_call_id;
			break;

		case 64:
			call_id = &instruction_instrumentation.nan_inf_instrument_fp64_call_id;
			break;

		default:
			break;
		}
	}

	if (!instruction_instrumentation.should_report_instrumentation_id)
	{
		instruction_instrumentation.should_report_instrumentation_id = create_variable_with_initializer(
			spv::StorageClassPrivate, builder.makeBoolType(),
			builder.makeBoolConstant(true), "ShouldReportInstrumentation");

		spv::Id u32_type = builder.makeUintType(32);
		spv::Id uvec4_type = builder.makeVectorType(u32_type, 4);
		spv::Id u32_array_type = builder.makeRuntimeArray(u32_type);
		builder.addDecoration(u32_array_type, spv::DecorationArrayStride, 4);
		spv::Id control_data = builder.makeStructType({ u32_array_type }, "InstrumentationControlDataSSBO");
		builder.addMemberDecoration(control_data, 0, spv::DecorationOffset, 0);
		builder.addMemberName(control_data, 0, "atomics");
		builder.addDecoration(control_data, spv::DecorationBlock);
		instruction_instrumentation.global_nan_inf_control_var_id =
			create_variable(spv::StorageClassStorageBuffer, control_data, "InstrumentationControlData");

		builder.addDecoration(instruction_instrumentation.global_nan_inf_control_var_id,
		                      spv::DecorationDescriptorSet, instruction_instrumentation.info.control_desc_set);

		builder.addDecoration(instruction_instrumentation.global_nan_inf_control_var_id,
		                      spv::DecorationBinding,
		                      instruction_instrumentation.info.control_binding);

		spv::Id payload_data_array = builder.makeRuntimeArray(uvec4_type);
		builder.addDecoration(payload_data_array, spv::DecorationArrayStride, 16);

		spv::Id payload_block = builder.makeStructType({ payload_data_array }, "InstrumentationDataSSBO");
		builder.addMemberName(payload_block, 0, "data");
		builder.addMemberDecoration(payload_block, 0, spv::DecorationOffset, 0);
		builder.addDecoration(payload_block, spv::DecorationBlock);
		instruction_instrumentation.global_nan_inf_data_var_id =
			create_variable(spv::StorageClassStorageBuffer, payload_block, "InstrumentationData");

		builder.addDecoration(instruction_instrumentation.global_nan_inf_data_var_id,
		                      spv::DecorationDescriptorSet, instruction_instrumentation.info.payload_desc_set);

		builder.addDecoration(instruction_instrumentation.global_nan_inf_data_var_id,
		                      spv::DecorationBinding,
		                      instruction_instrumentation.info.payload_binding);
	}

	if (call_id && !*call_id)
	{
		if (op == spv::OpAssumeTrueKHR)
			*call_id = build_assume_true_call_function(self, instruction_instrumentation);
		else
			*call_id = build_nan_inf_instrument_call_function(self, instruction_instrumentation, type_id);
	}

	auto call = std::make_unique<spv::Instruction>(builder.getUniqueId(), builder.makeVoidType(), spv::OpFunctionCall);
	call->addIdOperand(*call_id);
	call->addIdOperand(id);
	call->addIdOperand(builder.makeUintConstant(++instruction_instrumentation.instruction_count));
	bb->addInstruction(std::move(call));
}